

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O2

void __thiscall
icu_63::number::LocalizedNumberFormatter::getAffixImpl
          (LocalizedNumberFormatter *this,bool isPrefix,bool isNegative,UnicodeString *result,
          UErrorCode *status)

{
  ushort uVar1;
  bool bVar2;
  ushort uVar3;
  int32_t start;
  int32_t limit;
  UnicodeString UStack_1a8;
  UnicodeString local_168;
  NumberStringBuilder string;
  
  impl::NumberStringBuilder::NumberStringBuilder(&string);
  bVar2 = computeCompiled(this,status);
  if (bVar2) {
    start = impl::NumberFormatterImpl::getPrefixSuffix
                      (this->fCompiled,-isNegative | 1U,OTHER,&string,status);
  }
  else {
    start = impl::NumberFormatterImpl::getPrefixSuffixStatic
                      ((MacroProps *)this,-isNegative | 1U,OTHER,&string,status);
  }
  uVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
  uVar3 = 2;
  if ((uVar1 & 1) == 0) {
    uVar3 = uVar1 & 0x1e;
  }
  (result->fUnion).fStackFields.fLengthAndFlags = uVar3;
  if (isPrefix) {
    impl::NumberStringBuilder::toTempUnicodeString(&UStack_1a8,&string);
    UnicodeString::tempSubString(&local_168,&UStack_1a8,0,start);
    UnicodeString::append(result,&local_168);
  }
  else {
    impl::NumberStringBuilder::toTempUnicodeString(&UStack_1a8,&string);
    limit = impl::NumberStringBuilder::length(&string);
    UnicodeString::tempSubStringBetween(&local_168,&UStack_1a8,start,limit);
    UnicodeString::append(result,&local_168);
  }
  UnicodeString::~UnicodeString(&local_168);
  UnicodeString::~UnicodeString(&UStack_1a8);
  impl::NumberStringBuilder::~NumberStringBuilder(&string);
  return;
}

Assistant:

void LocalizedNumberFormatter::getAffixImpl(bool isPrefix, bool isNegative, UnicodeString& result,
                                            UErrorCode& status) const {
    NumberStringBuilder string;
    auto signum = static_cast<int8_t>(isNegative ? -1 : 1);
    // Always return affixes for plural form OTHER.
    static const StandardPlural::Form plural = StandardPlural::OTHER;
    int32_t prefixLength;
    if (computeCompiled(status)) {
        prefixLength = fCompiled->getPrefixSuffix(signum, plural, string, status);
    } else {
        prefixLength = NumberFormatterImpl::getPrefixSuffixStatic(fMacros, signum, plural, string, status);
    }
    result.remove();
    if (isPrefix) {
        result.append(string.toTempUnicodeString().tempSubStringBetween(0, prefixLength));
    } else {
        result.append(string.toTempUnicodeString().tempSubStringBetween(prefixLength, string.length()));
    }
}